

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_command * nk__begin(nk_context *ctx)

{
  void *pvVar1;
  bool bVar2;
  nk_byte *buffer;
  nk_window *iter;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3b49,"const struct nk_command *nk__begin(struct nk_context *)");
  }
  if (ctx == (nk_context *)0x0) {
    ctx_local = (nk_context *)0x0;
  }
  else if (ctx->count == 0) {
    ctx_local = (nk_context *)0x0;
  }
  else {
    pvVar1 = (ctx->memory).memory.ptr;
    if (ctx->build == 0) {
      nk_build(ctx);
      ctx->build = 1;
    }
    buffer = (nk_byte *)ctx->begin;
    while( true ) {
      bVar2 = false;
      if (((buffer != (nk_byte *)0x0) &&
          (bVar2 = true, *(long *)(buffer + 0x90) != *(long *)(buffer + 0x98))) &&
         (bVar2 = true, (*(uint *)(buffer + 0x48) & 0x2000) == 0)) {
        bVar2 = *(uint *)buffer != ctx->seq;
      }
      if (!bVar2) break;
      buffer = *(nk_byte **)(buffer + 0x1c0);
    }
    if (buffer == (nk_byte *)0x0) {
      ctx_local = (nk_context *)0x0;
    }
    else {
      ctx_local = (nk_context *)((long)pvVar1 + *(long *)(buffer + 0x90));
    }
  }
  return (nk_command *)ctx_local;
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
    struct nk_window *iter;
    nk_byte *buffer;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    if (!ctx->count) return 0;

    buffer = (nk_byte*)ctx->memory.memory.ptr;
    if (!ctx->build) {
        nk_build(ctx);
        ctx->build = nk_true;
    }
    iter = ctx->begin;
    while (iter && ((iter->buffer.begin == iter->buffer.end) ||
        (iter->flags & NK_WINDOW_HIDDEN) || iter->seq != ctx->seq))
        iter = iter->next;
    if (!iter) return 0;
    return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}